

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  seqDef **ppsVar3;
  ulong *puVar4;
  ulong *puVar5;
  int *piVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  BYTE *pBVar11;
  U32 *pUVar12;
  seqDef *psVar13;
  uint uVar14;
  uint uVar15;
  BYTE *op_1;
  ulong *puVar16;
  ulong uVar17;
  BYTE *pBVar18;
  byte bVar19;
  uint uVar20;
  U32 UVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  long *plVar25;
  long *plVar26;
  BYTE *op_4;
  BYTE *pBVar27;
  uint uVar28;
  BYTE *ip;
  uint uVar29;
  BYTE *pStart_3;
  long *plVar30;
  ulong *puVar31;
  ulong uVar32;
  U32 *hashTable;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  int local_b8;
  BYTE *base;
  BYTE *iend;
  BYTE *ilimit;
  int local_68;
  U32 prefixStartIndex;
  BYTE *prefixStart;
  
  pBVar11 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  pBVar27 = pBVar11 + uVar15;
  puVar5 = (ulong *)((long)src + srcSize);
  uVar8 = *rep;
  uVar9 = rep[1];
  plVar30 = (long *)((ulong)((int)src == (int)pBVar27) + (long)src);
  uVar20 = (int)plVar30 - (int)pBVar27;
  uVar32 = (ulong)uVar9;
  if (uVar20 < uVar9) {
    uVar32 = 0;
  }
  uVar29 = (uint)uVar32;
  uVar28 = 0;
  if (uVar8 <= uVar20) {
    uVar28 = uVar8;
  }
  plVar7 = (long *)((long)src + (srcSize - 8));
  uVar10 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  local_b8 = (int)pBVar11;
  if (uVar10 == 5) {
    if (plVar30 < plVar7) {
      uVar10 = (ms->cParams).targetLength;
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar16 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      do {
        uVar23 = (ulong)(*plVar30 * -0x30e4432345000000) >> (bVar19 & 0x3f);
        uVar34 = (long)plVar30 - (long)pBVar11;
        uVar29 = pUVar12[uVar23];
        UVar21 = (U32)uVar34;
        pUVar12[uVar23] = UVar21;
        if (uVar28 == 0) {
LAB_004e1cd4:
          if ((uVar15 < uVar29) && (piVar6 = (int *)(pBVar11 + uVar29), *piVar6 == (int)*plVar30)) {
            puVar4 = (ulong *)((long)plVar30 + 4);
            puVar24 = (ulong *)(piVar6 + 1);
            puVar31 = puVar4;
            if (puVar4 < puVar1) {
              uVar23 = *puVar4 ^ *puVar24;
              uVar32 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = uVar32 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar4) {
                puVar31 = (ulong *)((long)plVar30 + 0xc);
                puVar24 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar31) goto LAB_004e2041;
                  uVar23 = *puVar24;
                  uVar22 = *puVar31;
                  uVar17 = uVar22 ^ uVar23;
                  uVar32 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = (long)puVar31 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar31 = puVar31 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar23 == uVar22);
              }
            }
            else {
LAB_004e2041:
              if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar31 < puVar5) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
              }
              uVar32 = (long)puVar31 - (long)puVar4;
            }
            lVar35 = uVar32 + 4;
            plVar26 = plVar30;
            if ((uVar15 < uVar29) && (src < plVar30)) {
              pBVar18 = pBVar11 + ((ulong)uVar29 - 1);
              do {
                plVar25 = (long *)((long)plVar26 + -1);
                if ((*(BYTE *)plVar25 != *pBVar18) ||
                   (lVar35 = lVar35 + 1, plVar26 = plVar25, pBVar18 <= pBVar27)) break;
                pBVar18 = pBVar18 + -1;
              } while (src < plVar25);
            }
            base._0_4_ = (int)piVar6;
            uVar29 = (int)plVar30 - (int)base;
            uVar32 = (long)plVar26 - (long)src;
            plVar25 = (long *)seqStore->lit;
            plVar30 = (long *)((long)plVar25 + uVar32);
            do {
              *plVar25 = *src;
              plVar25 = plVar25 + 1;
              src = (void *)((long)src + 8);
            } while (plVar25 < plVar30);
            seqStore->lit = seqStore->lit + uVar32;
            if (0xffff < uVar32) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar22 = lVar35 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar32;
            psVar13->offset = uVar29 + 3;
            uVar32 = (ulong)uVar28;
            uVar28 = uVar29;
            goto joined_r0x004e2140;
          }
          plVar30 = (long *)((long)plVar30 +
                            ((long)plVar30 - (long)src >> 8) + (ulong)(uVar10 + (uVar10 == 0)));
        }
        else {
          plVar26 = (long *)((long)plVar30 + 1);
          uVar23 = (ulong)uVar28;
          if (*(int *)((long)plVar26 - uVar23) != *(int *)((long)plVar30 + 1)) goto LAB_004e1cd4;
          puVar4 = (ulong *)((long)plVar30 + 5);
          puVar24 = (ulong *)((long)plVar30 + (5 - uVar23));
          puVar31 = puVar4;
          if (puVar4 < puVar1) {
            uVar17 = *puVar4 ^ *puVar24;
            uVar22 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
            if (*puVar24 == *puVar4) {
              puVar31 = (ulong *)((long)plVar30 + 0xd);
              puVar24 = (ulong *)((long)plVar30 + (0xd - uVar23));
              do {
                if (puVar1 <= puVar31) goto LAB_004e1d9b;
                uVar23 = *puVar24;
                uVar17 = *puVar31;
                uVar33 = uVar17 ^ uVar23;
                uVar22 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (long)puVar31 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar31 = puVar31 + 1;
                puVar24 = puVar24 + 1;
              } while (uVar23 == uVar17);
            }
          }
          else {
LAB_004e1d9b:
            if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar31 < puVar5) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
            }
            uVar22 = (long)puVar31 - (long)puVar4;
          }
          uVar23 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar30 = (long *)((long)plVar25 + uVar23);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar30);
          seqStore->lit = seqStore->lit + uVar23;
          if (0xffff < uVar23) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar35 = uVar22 + 4;
          uVar22 = uVar22 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar23;
          psVar13->offset = 1;
joined_r0x004e2140:
          if (0xffff < uVar22) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar35 + (long)plVar26);
          psVar13->matchLength = (U16)uVar22;
          *ppsVar3 = psVar13 + 1;
          plVar30 = (long *)src;
          if (src <= plVar7) {
            pUVar12[(ulong)(*(long *)(pBVar11 + (uVar34 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar19 & 0x3f)] = UVar21 + 2;
            pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar19 & 0x3f)] =
                 ((int)src + -2) - local_b8;
            uVar23 = (ulong)uVar28;
            do {
              uVar34 = uVar23;
              uVar29 = (uint)uVar32;
              plVar30 = (long *)src;
              uVar28 = (uint)uVar34;
              if ((uVar29 == 0) || ((int)*src != *(int *)((long)src - uVar32))) break;
              puVar4 = (ulong *)((long)src + 4);
              puVar24 = (ulong *)((long)src + (4 - uVar32));
              puVar31 = puVar4;
              if (puVar4 < puVar1) {
                uVar22 = *puVar4 ^ *puVar24;
                uVar23 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar23 = uVar23 >> 3 & 0x1fffffff;
                if (*puVar24 == *puVar4) {
                  puVar31 = (ulong *)((long)src + 0xc);
                  puVar24 = (ulong *)((long)src + (0xc - uVar32));
                  do {
                    if (puVar1 <= puVar31) goto LAB_004e1f5a;
                    uVar22 = *puVar24;
                    uVar17 = *puVar31;
                    uVar33 = uVar17 ^ uVar22;
                    uVar23 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    uVar23 = (long)puVar31 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar31 = puVar31 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar22 == uVar17);
                }
              }
              else {
LAB_004e1f5a:
                if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar31 < puVar5) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
                }
                uVar23 = (long)puVar31 - (long)puVar4;
              }
              pUVar12[(ulong)(*src * -0x30e4432345000000) >> (bVar19 & 0x3f)] = (int)src - local_b8;
              *(long *)seqStore->lit = *src;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar23 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar23 + 1);
              seqStore->sequences = psVar13 + 1;
              src = (void *)((long)src + uVar23 + 4);
              uVar23 = uVar32;
              uVar32 = uVar34;
              plVar30 = (long *)src;
              uVar28 = uVar29;
            } while (src <= plVar7);
          }
        }
        uVar29 = (uint)uVar32;
      } while (plVar30 < plVar7);
    }
  }
  else if (uVar10 == 6) {
    if (plVar30 < plVar7) {
      uVar10 = (ms->cParams).targetLength;
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar16 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      do {
        uVar23 = (ulong)(*plVar30 * -0x30e4432340650000) >> (bVar19 & 0x3f);
        uVar34 = (long)plVar30 - (long)pBVar11;
        uVar29 = pUVar12[uVar23];
        UVar21 = (U32)uVar34;
        pUVar12[uVar23] = UVar21;
        if (uVar28 == 0) {
LAB_004e1739:
          if ((uVar15 < uVar29) && (piVar6 = (int *)(pBVar11 + uVar29), *piVar6 == (int)*plVar30)) {
            puVar4 = (ulong *)((long)plVar30 + 4);
            puVar24 = (ulong *)(piVar6 + 1);
            puVar31 = puVar4;
            if (puVar4 < puVar1) {
              uVar23 = *puVar4 ^ *puVar24;
              uVar32 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = uVar32 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar4) {
                puVar31 = (ulong *)((long)plVar30 + 0xc);
                puVar24 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar31) goto LAB_004e1a99;
                  uVar23 = *puVar24;
                  uVar22 = *puVar31;
                  uVar17 = uVar22 ^ uVar23;
                  uVar32 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = (long)puVar31 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar31 = puVar31 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar23 == uVar22);
              }
            }
            else {
LAB_004e1a99:
              if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar31 < puVar5) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
              }
              uVar32 = (long)puVar31 - (long)puVar4;
            }
            lVar35 = uVar32 + 4;
            plVar26 = plVar30;
            if ((uVar15 < uVar29) && (src < plVar30)) {
              pBVar18 = pBVar11 + ((ulong)uVar29 - 1);
              do {
                plVar25 = (long *)((long)plVar26 + -1);
                if ((*(BYTE *)plVar25 != *pBVar18) ||
                   (lVar35 = lVar35 + 1, plVar26 = plVar25, pBVar18 <= pBVar27)) break;
                pBVar18 = pBVar18 + -1;
              } while (src < plVar25);
            }
            local_68 = (int)piVar6;
            uVar29 = (int)plVar30 - local_68;
            uVar32 = (long)plVar26 - (long)src;
            plVar25 = (long *)seqStore->lit;
            plVar30 = (long *)((long)plVar25 + uVar32);
            do {
              *plVar25 = *src;
              plVar25 = plVar25 + 1;
              src = (void *)((long)src + 8);
            } while (plVar25 < plVar30);
            seqStore->lit = seqStore->lit + uVar32;
            if (0xffff < uVar32) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar22 = lVar35 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar32;
            psVar13->offset = uVar29 + 3;
            uVar32 = (ulong)uVar28;
            uVar28 = uVar29;
            goto joined_r0x004e1b96;
          }
          plVar30 = (long *)((long)plVar30 +
                            ((long)plVar30 - (long)src >> 8) + (ulong)(uVar10 + (uVar10 == 0)));
        }
        else {
          plVar26 = (long *)((long)plVar30 + 1);
          uVar23 = (ulong)uVar28;
          if (*(int *)((long)plVar26 - uVar23) != *(int *)((long)plVar30 + 1)) goto LAB_004e1739;
          puVar4 = (ulong *)((long)plVar30 + 5);
          puVar24 = (ulong *)((long)plVar30 + (5 - uVar23));
          puVar31 = puVar4;
          if (puVar4 < puVar1) {
            uVar17 = *puVar4 ^ *puVar24;
            uVar22 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
            if (*puVar24 == *puVar4) {
              puVar31 = (ulong *)((long)plVar30 + 0xd);
              puVar24 = (ulong *)((long)plVar30 + (0xd - uVar23));
              do {
                if (puVar1 <= puVar31) goto LAB_004e17fb;
                uVar23 = *puVar24;
                uVar17 = *puVar31;
                uVar33 = uVar17 ^ uVar23;
                uVar22 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (long)puVar31 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar31 = puVar31 + 1;
                puVar24 = puVar24 + 1;
              } while (uVar23 == uVar17);
            }
          }
          else {
LAB_004e17fb:
            if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar31 < puVar5) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
            }
            uVar22 = (long)puVar31 - (long)puVar4;
          }
          uVar23 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar30 = (long *)((long)plVar25 + uVar23);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar30);
          seqStore->lit = seqStore->lit + uVar23;
          if (0xffff < uVar23) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar35 = uVar22 + 4;
          uVar22 = uVar22 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar23;
          psVar13->offset = 1;
joined_r0x004e1b96:
          if (0xffff < uVar22) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar35 + (long)plVar26);
          psVar13->matchLength = (U16)uVar22;
          *ppsVar3 = psVar13 + 1;
          plVar30 = (long *)src;
          if (src <= plVar7) {
            pUVar12[(ulong)(*(long *)(pBVar11 + (uVar34 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar19 & 0x3f)] = UVar21 + 2;
            pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar19 & 0x3f)] =
                 ((int)src + -2) - local_b8;
            uVar23 = (ulong)uVar28;
            do {
              uVar34 = uVar23;
              uVar29 = (uint)uVar32;
              plVar30 = (long *)src;
              uVar28 = (uint)uVar34;
              if ((uVar29 == 0) || ((int)*src != *(int *)((long)src - uVar32))) break;
              puVar4 = (ulong *)((long)src + 4);
              puVar24 = (ulong *)((long)src + (4 - uVar32));
              puVar31 = puVar4;
              if (puVar4 < puVar1) {
                uVar22 = *puVar4 ^ *puVar24;
                uVar23 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar23 = uVar23 >> 3 & 0x1fffffff;
                if (*puVar24 == *puVar4) {
                  puVar31 = (ulong *)((long)src + 0xc);
                  puVar24 = (ulong *)((long)src + (0xc - uVar32));
                  do {
                    if (puVar1 <= puVar31) goto LAB_004e19b8;
                    uVar22 = *puVar24;
                    uVar17 = *puVar31;
                    uVar33 = uVar17 ^ uVar22;
                    uVar23 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    uVar23 = (long)puVar31 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar31 = puVar31 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar22 == uVar17);
                }
              }
              else {
LAB_004e19b8:
                if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar31 < puVar5) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
                }
                uVar23 = (long)puVar31 - (long)puVar4;
              }
              pUVar12[(ulong)(*src * -0x30e4432340650000) >> (bVar19 & 0x3f)] = (int)src - local_b8;
              *(long *)seqStore->lit = *src;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar23 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar23 + 1);
              seqStore->sequences = psVar13 + 1;
              src = (void *)((long)src + uVar23 + 4);
              uVar23 = uVar32;
              uVar32 = uVar34;
              plVar30 = (long *)src;
              uVar28 = uVar29;
            } while (src <= plVar7);
          }
        }
        uVar29 = (uint)uVar32;
      } while (plVar30 < plVar7);
    }
  }
  else if (uVar10 == 7) {
    if (plVar30 < plVar7) {
      uVar10 = (ms->cParams).targetLength;
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar16 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      do {
        uVar23 = (ulong)(*plVar30 * -0x30e44323405a9d00) >> (bVar19 & 0x3f);
        uVar34 = (long)plVar30 - (long)pBVar11;
        uVar29 = pUVar12[uVar23];
        UVar21 = (U32)uVar34;
        pUVar12[uVar23] = UVar21;
        if (uVar28 == 0) {
LAB_004e119a:
          if ((uVar15 < uVar29) && (piVar6 = (int *)(pBVar11 + uVar29), *piVar6 == (int)*plVar30)) {
            puVar4 = (ulong *)((long)plVar30 + 4);
            puVar24 = (ulong *)(piVar6 + 1);
            puVar31 = puVar4;
            if (puVar4 < puVar1) {
              uVar23 = *puVar4 ^ *puVar24;
              uVar32 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = uVar32 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar4) {
                puVar31 = (ulong *)((long)plVar30 + 0xc);
                puVar24 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar31) goto LAB_004e14f9;
                  uVar23 = *puVar24;
                  uVar22 = *puVar31;
                  uVar17 = uVar22 ^ uVar23;
                  uVar32 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = (long)puVar31 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar31 = puVar31 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar23 == uVar22);
              }
            }
            else {
LAB_004e14f9:
              if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar31 < puVar5) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
              }
              uVar32 = (long)puVar31 - (long)puVar4;
            }
            lVar35 = uVar32 + 4;
            plVar26 = plVar30;
            if ((uVar15 < uVar29) && (src < plVar30)) {
              pBVar18 = pBVar11 + ((ulong)uVar29 - 1);
              do {
                plVar25 = (long *)((long)plVar26 + -1);
                if ((*(BYTE *)plVar25 != *pBVar18) ||
                   (lVar35 = lVar35 + 1, plVar26 = plVar25, pBVar18 <= pBVar27)) break;
                pBVar18 = pBVar18 + -1;
              } while (src < plVar25);
            }
            local_68 = (int)piVar6;
            uVar29 = (int)plVar30 - local_68;
            uVar32 = (long)plVar26 - (long)src;
            plVar25 = (long *)seqStore->lit;
            plVar30 = (long *)((long)plVar25 + uVar32);
            do {
              *plVar25 = *src;
              plVar25 = plVar25 + 1;
              src = (void *)((long)src + 8);
            } while (plVar25 < plVar30);
            seqStore->lit = seqStore->lit + uVar32;
            if (0xffff < uVar32) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar22 = lVar35 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar32;
            psVar13->offset = uVar29 + 3;
            uVar32 = (ulong)uVar28;
            uVar28 = uVar29;
            goto joined_r0x004e15f5;
          }
          plVar30 = (long *)((long)plVar30 +
                            ((long)plVar30 - (long)src >> 8) + (ulong)(uVar10 + (uVar10 == 0)));
        }
        else {
          plVar26 = (long *)((long)plVar30 + 1);
          uVar23 = (ulong)uVar28;
          if (*(int *)((long)plVar26 - uVar23) != *(int *)((long)plVar30 + 1)) goto LAB_004e119a;
          puVar4 = (ulong *)((long)plVar30 + 5);
          puVar24 = (ulong *)((long)plVar30 + (5 - uVar23));
          puVar31 = puVar4;
          if (puVar4 < puVar1) {
            uVar17 = *puVar4 ^ *puVar24;
            uVar22 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
            if (*puVar24 == *puVar4) {
              puVar31 = (ulong *)((long)plVar30 + 0xd);
              puVar24 = (ulong *)((long)plVar30 + (0xd - uVar23));
              do {
                if (puVar1 <= puVar31) goto LAB_004e125c;
                uVar23 = *puVar24;
                uVar17 = *puVar31;
                uVar33 = uVar17 ^ uVar23;
                uVar22 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (long)puVar31 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar31 = puVar31 + 1;
                puVar24 = puVar24 + 1;
              } while (uVar23 == uVar17);
            }
          }
          else {
LAB_004e125c:
            if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar31 < puVar5) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
            }
            uVar22 = (long)puVar31 - (long)puVar4;
          }
          uVar23 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar30 = (long *)((long)plVar25 + uVar23);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar30);
          seqStore->lit = seqStore->lit + uVar23;
          if (0xffff < uVar23) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar35 = uVar22 + 4;
          uVar22 = uVar22 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar23;
          psVar13->offset = 1;
joined_r0x004e15f5:
          if (0xffff < uVar22) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar35 + (long)plVar26);
          psVar13->matchLength = (U16)uVar22;
          *ppsVar3 = psVar13 + 1;
          plVar30 = (long *)src;
          if (src <= plVar7) {
            pUVar12[(ulong)(*(long *)(pBVar11 + (uVar34 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar19 & 0x3f)] = UVar21 + 2;
            pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] =
                 ((int)src + -2) - local_b8;
            uVar23 = (ulong)uVar28;
            do {
              uVar34 = uVar23;
              uVar29 = (uint)uVar32;
              plVar30 = (long *)src;
              uVar28 = (uint)uVar34;
              if ((uVar29 == 0) || ((int)*src != *(int *)((long)src - uVar32))) break;
              puVar4 = (ulong *)((long)src + 4);
              puVar24 = (ulong *)((long)src + (4 - uVar32));
              puVar31 = puVar4;
              if (puVar4 < puVar1) {
                uVar22 = *puVar4 ^ *puVar24;
                uVar23 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar23 = uVar23 >> 3 & 0x1fffffff;
                if (*puVar24 == *puVar4) {
                  puVar31 = (ulong *)((long)src + 0xc);
                  puVar24 = (ulong *)((long)src + (0xc - uVar32));
                  do {
                    if (puVar1 <= puVar31) goto LAB_004e1418;
                    uVar22 = *puVar24;
                    uVar17 = *puVar31;
                    uVar33 = uVar17 ^ uVar22;
                    uVar23 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    uVar23 = (long)puVar31 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar31 = puVar31 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar22 == uVar17);
                }
              }
              else {
LAB_004e1418:
                if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar31 < puVar5) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
                }
                uVar23 = (long)puVar31 - (long)puVar4;
              }
              pUVar12[(ulong)(*src * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = (int)src - local_b8;
              *(long *)seqStore->lit = *src;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar23 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar23 + 1);
              seqStore->sequences = psVar13 + 1;
              src = (void *)((long)src + uVar23 + 4);
              uVar23 = uVar32;
              uVar32 = uVar34;
              plVar30 = (long *)src;
              uVar28 = uVar29;
            } while (src <= plVar7);
          }
        }
        uVar29 = (uint)uVar32;
      } while (plVar30 < plVar7);
    }
  }
  else if (plVar30 < plVar7) {
    uVar10 = (ms->cParams).targetLength;
    bVar19 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar16 = (ulong *)((long)puVar5 - 1);
    ppsVar3 = &seqStore->sequences;
    do {
      uVar14 = (uint)((int)*plVar30 * -0x61c8864f) >> (bVar19 & 0x1f);
      uVar23 = (long)plVar30 - (long)pBVar11;
      uVar29 = pUVar12[uVar14];
      UVar21 = (U32)uVar23;
      pUVar12[uVar14] = UVar21;
      if (uVar28 == 0) {
LAB_004e2263:
        if ((uVar15 < uVar29) && (piVar6 = (int *)(pBVar11 + uVar29), *piVar6 == (int)*plVar30)) {
          puVar4 = (ulong *)((long)plVar30 + 4);
          puVar24 = (ulong *)(piVar6 + 1);
          puVar31 = puVar4;
          if (puVar4 < puVar1) {
            uVar34 = *puVar4 ^ *puVar24;
            uVar32 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
            if (*puVar24 == *puVar4) {
              puVar31 = (ulong *)((long)plVar30 + 0xc);
              puVar24 = (ulong *)(piVar6 + 3);
              do {
                if (puVar1 <= puVar31) goto LAB_004e25be;
                uVar34 = *puVar24;
                uVar22 = *puVar31;
                uVar17 = uVar22 ^ uVar34;
                uVar32 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (long)puVar31 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar31 = puVar31 + 1;
                puVar24 = puVar24 + 1;
              } while (uVar34 == uVar22);
            }
          }
          else {
LAB_004e25be:
            if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar31 < puVar5) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
            }
            uVar32 = (long)puVar31 - (long)puVar4;
          }
          lVar35 = uVar32 + 4;
          plVar26 = plVar30;
          if ((uVar15 < uVar29) && (src < plVar30)) {
            pBVar18 = pBVar11 + ((ulong)uVar29 - 1);
            do {
              plVar25 = (long *)((long)plVar26 + -1);
              if ((*(BYTE *)plVar25 != *pBVar18) ||
                 (lVar35 = lVar35 + 1, plVar26 = plVar25, pBVar18 <= pBVar27)) break;
              pBVar18 = pBVar18 + -1;
            } while (src < plVar25);
          }
          base._0_4_ = (int)piVar6;
          uVar29 = (int)plVar30 - (int)base;
          uVar32 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar30 = (long *)((long)plVar25 + uVar32);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar30);
          seqStore->lit = seqStore->lit + uVar32;
          if (0xffff < uVar32) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar22 = lVar35 - 3;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar32;
          psVar13->offset = uVar29 + 3;
          uVar32 = (ulong)uVar28;
          uVar28 = uVar29;
          goto joined_r0x004e26c4;
        }
        plVar30 = (long *)((long)plVar30 +
                          ((long)plVar30 - (long)src >> 8) + (ulong)(uVar10 + (uVar10 == 0)));
      }
      else {
        plVar26 = (long *)((long)plVar30 + 1);
        uVar34 = (ulong)uVar28;
        if (*(int *)((long)plVar26 - uVar34) != *(int *)((long)plVar30 + 1)) goto LAB_004e2263;
        puVar4 = (ulong *)((long)plVar30 + 5);
        puVar24 = (ulong *)((long)plVar30 + (5 - uVar34));
        puVar31 = puVar4;
        if (puVar4 < puVar1) {
          uVar17 = *puVar4 ^ *puVar24;
          uVar22 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar22 = uVar22 >> 3 & 0x1fffffff;
          if (*puVar24 == *puVar4) {
            puVar31 = (ulong *)((long)plVar30 + 0xd);
            puVar24 = (ulong *)((long)plVar30 + (0xd - uVar34));
            do {
              if (puVar1 <= puVar31) goto LAB_004e231d;
              uVar34 = *puVar24;
              uVar17 = *puVar31;
              uVar33 = uVar17 ^ uVar34;
              uVar22 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = (long)puVar31 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar4);
              puVar31 = puVar31 + 1;
              puVar24 = puVar24 + 1;
            } while (uVar34 == uVar17);
          }
        }
        else {
LAB_004e231d:
          if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar24 = (ulong *)((long)puVar24 + 4);
          }
          if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar24 = (ulong *)((long)puVar24 + 2);
          }
          if (puVar31 < puVar5) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
          }
          uVar22 = (long)puVar31 - (long)puVar4;
        }
        uVar34 = (long)plVar26 - (long)src;
        plVar25 = (long *)seqStore->lit;
        plVar30 = (long *)((long)plVar25 + uVar34);
        do {
          *plVar25 = *src;
          plVar25 = plVar25 + 1;
          src = (void *)((long)src + 8);
        } while (plVar25 < plVar30);
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        lVar35 = uVar22 + 4;
        uVar22 = uVar22 + 1;
        psVar13 = *ppsVar3;
        psVar13->litLength = (U16)uVar34;
        psVar13->offset = 1;
joined_r0x004e26c4:
        if (0xffff < uVar22) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar35 + (long)plVar26);
        psVar13->matchLength = (U16)uVar22;
        *ppsVar3 = psVar13 + 1;
        plVar30 = (long *)src;
        if (src <= plVar7) {
          pUVar12[(uint)(*(int *)(pBVar11 + (uVar23 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar19 & 0x1f)] = UVar21 + 2;
          pUVar12[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar19 & 0x1f)] =
               ((int)src + -2) - local_b8;
          uVar23 = (ulong)uVar28;
          do {
            uVar34 = uVar23;
            uVar29 = (uint)uVar32;
            plVar30 = (long *)src;
            uVar28 = (uint)uVar34;
            if ((uVar29 == 0) || ((int)*src != *(int *)((long)src - uVar32))) break;
            puVar4 = (ulong *)((long)src + 4);
            puVar24 = (ulong *)((long)src + (4 - uVar32));
            puVar31 = puVar4;
            if (puVar4 < puVar1) {
              uVar22 = *puVar4 ^ *puVar24;
              uVar23 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = uVar23 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar4) {
                puVar31 = (ulong *)((long)src + 0xc);
                puVar24 = (ulong *)((long)src + (0xc - uVar32));
                do {
                  if (puVar1 <= puVar31) goto LAB_004e24dc;
                  uVar22 = *puVar24;
                  uVar17 = *puVar31;
                  uVar33 = uVar17 ^ uVar22;
                  uVar23 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  uVar23 = (long)puVar31 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar31 = puVar31 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar22 == uVar17);
              }
            }
            else {
LAB_004e24dc:
              if ((puVar31 < puVar2) && ((int)*puVar24 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar31 < puVar16) && ((short)*puVar24 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar31 < puVar5) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar24 == (char)*puVar31));
              }
              uVar23 = (long)puVar31 - (long)puVar4;
            }
            pUVar12[(uint)((int)*src * -0x61c8864f) >> (bVar19 & 0x1f)] = (int)src - local_b8;
            *(long *)seqStore->lit = *src;
            psVar13 = seqStore->sequences;
            psVar13->litLength = 0;
            psVar13->offset = 1;
            if (0xffff < uVar23 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->matchLength = (U16)(uVar23 + 1);
            seqStore->sequences = psVar13 + 1;
            src = (void *)((long)src + uVar23 + 4);
            uVar23 = uVar32;
            uVar32 = uVar34;
            plVar30 = (long *)src;
            uVar28 = uVar29;
          } while (src <= plVar7);
        }
      }
      uVar29 = (uint)uVar32;
    } while (plVar30 < plVar7);
  }
  uVar15 = 0;
  if (uVar20 < uVar9) {
    uVar15 = uVar9;
  }
  if (uVar20 < uVar8) {
    uVar15 = uVar8;
  }
  if (uVar28 == 0) {
    uVar28 = uVar15;
  }
  if (uVar29 != 0) {
    uVar15 = uVar29;
  }
  *rep = uVar28;
  rep[1] = uVar15;
  return (long)puVar5 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}